

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Result __thiscall wabt::interp::Table::Fill(Table *this,Store *store,u32 offset,Ref ref,u32 size)

{
  pointer pRVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  Enum EVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  uVar5 = (long)(this->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  uVar7 = (ulong)size;
  uVar8 = (ulong)offset;
  EVar9 = Error;
  if (uVar8 <= uVar5 - uVar7 && uVar7 <= uVar5) {
    bVar4 = Store::HasValueType(store,ref,
                                (ValueType)*(Enum *)&(this->type_).super_ExternType.field_0xc);
    auVar3 = _DAT_001d1d20;
    auVar2 = _DAT_001d1d10;
    if (bVar4) {
      if (size != 0) {
        pRVar1 = (this->elements_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = uVar7 + 0x1fffffffffffffff & 0x1fffffffffffffff;
        auVar10._8_4_ = (int)uVar5;
        auVar10._0_8_ = uVar5;
        auVar10._12_4_ = (int)(uVar5 >> 0x20);
        lVar6 = 0;
        auVar10 = auVar10 ^ _DAT_001d1d20;
        do {
          auVar11._8_4_ = (int)lVar6;
          auVar11._0_8_ = lVar6;
          auVar11._12_4_ = (int)((ulong)lVar6 >> 0x20);
          auVar11 = (auVar11 | auVar2) ^ auVar3;
          if ((bool)(~(auVar11._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar11._0_4_ ||
                      auVar10._4_4_ < auVar11._4_4_) & 1)) {
            pRVar1[uVar8 + lVar6].index = ref.index;
          }
          if ((auVar11._12_4_ != auVar10._12_4_ || auVar11._8_4_ <= auVar10._8_4_) &&
              auVar11._12_4_ <= auVar10._12_4_) {
            pRVar1[uVar8 + lVar6 + 1].index = ref.index;
          }
          lVar6 = lVar6 + 2;
        } while ((uVar5 - ((uint)(uVar7 + 0x1fffffffffffffff) & 1)) + 2 != lVar6);
      }
      EVar9 = Ok;
    }
  }
  return (Result)EVar9;
}

Assistant:

Result Table::Fill(Store& store, u32 offset, Ref ref, u32 size) {
  if (IsValidRange(offset, size) &&
      store.HasValueType(ref, type_.element)) {
    std::fill(elements_.begin() + offset, elements_.begin() + offset + size,
              ref);
    return Result::Ok;
  }
  return Result::Error;
}